

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O1

void dummy_Op_IncrementInPlace(void)

{
  return;
}

Assistant:

Var JavascriptMath::Increment_Full(Var aRight, ScriptContext* scriptContext)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_Increment_Full);
            if (TaggedInt::Is(aRight))
            {
                return TaggedInt::Increment(aRight, scriptContext);
            }
            if (VarIs<JavascriptBigInt>(aRight))
            {
                return JavascriptBigInt::Increment(aRight);
            }

            double inc = Increment_Helper(aRight, scriptContext);
            return JavascriptNumber::ToVarIntCheck(inc, scriptContext);
            JIT_HELPER_END(Op_Increment_Full);
        }